

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfileinfogatherer_p.cpp
# Opt level: O3

void QFileInfoGatherer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == updates && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == newListOfFiles && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == nameResolved && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == directoryLoaded && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    goto switchD_0060c619_caseD_7;
  }
  if (_c != InvokeMetaMethod) goto switchD_0060c619_caseD_7;
  switch(_id) {
  case 0:
    local_28.ptr = (QString *)_a[1];
    local_28.size = (qsizetype)_a[2];
    iVar3 = 0;
    break;
  case 1:
    local_28.ptr = (QString *)_a[1];
    local_28.size = (qsizetype)_a[2];
    iVar3 = 1;
    break;
  case 2:
    local_28.ptr = (QString *)_a[1];
    local_28.size = (qsizetype)_a[2];
    iVar3 = 2;
    break;
  case 3:
    local_28.ptr = (QString *)_a[1];
    iVar3 = 3;
    break;
  case 4:
    local_28.d = (Data *)0x0;
    local_28.ptr = (QString *)0x0;
    local_28.size = 0;
    fetchExtendedInformation((QFileInfoGatherer *)_o,(QString *)_a[1],(QStringList *)&local_28);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
    goto switchD_0060c619_caseD_7;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      fetchExtendedInformation((QFileInfoGatherer *)_o,(QString *)_a[1],(QStringList *)_a[2]);
      return;
    }
    goto LAB_0060c7e8;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      updateFile((QFileInfoGatherer *)_o,(QString *)_a[1]);
      return;
    }
    goto LAB_0060c7e8;
  default:
    goto switchD_0060c619_caseD_7;
  case 8:
    *(undefined8 *)(_o + 0x58) = *_a[1];
    goto switchD_0060c619_caseD_7;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      driveAdded((QFileInfoGatherer *)_o);
      return;
    }
    goto LAB_0060c7e8;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      driveRemoved((QFileInfoGatherer *)_o);
      return;
    }
    goto LAB_0060c7e8;
  }
  local_28.d = (Data *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_28.d);
switchD_0060c619_caseD_7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_0060c7e8:
  __stack_chk_fail();
}

Assistant:

void QFileInfoGatherer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFileInfoGatherer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updates((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<std::pair<QString,QFileInfo>>>>(_a[2]))); break;
        case 1: _t->newListOfFiles((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 2: _t->nameResolved((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 4: _t->list((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->fetchExtendedInformation((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 6: _t->updateFile((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->setResolveSymlinks((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setIconProvider((*reinterpret_cast< std::add_pointer_t<QAbstractFileIconProvider*>>(_a[1]))); break;
        case 9: _t->driveAdded(); break;
        case 10: _t->driveRemoved(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QList<std::pair<QString,QFileInfo>> & )>(_a, &QFileInfoGatherer::updates, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QStringList & ) const>(_a, &QFileInfoGatherer::newListOfFiles, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QString & ) const>(_a, &QFileInfoGatherer::nameResolved, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & )>(_a, &QFileInfoGatherer::directoryLoaded, 3))
            return;
    }
}